

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_utils.cc
# Opt level: O3

bool draco::parser::ParseString(DecoderBuffer *buffer,string *out_string)

{
  long lVar1;
  int iVar2;
  
  out_string->_M_string_length = 0;
  *(out_string->_M_dataplus)._M_p = '\0';
  SkipWhitespace(buffer);
  while( true ) {
    lVar1 = buffer->pos_ + 1;
    if (buffer->data_size_ < lVar1) {
      return true;
    }
    iVar2 = isspace((uint)(byte)buffer->data_[buffer->pos_]);
    if (iVar2 != 0) break;
    buffer->pos_ = lVar1;
    std::__cxx11::string::push_back((char)out_string);
  }
  return true;
}

Assistant:

bool ParseString(DecoderBuffer *buffer, std::string *out_string) {
  out_string->clear();
  SkipWhitespace(buffer);
  bool end_reached = false;
  while (!PeekWhitespace(buffer, &end_reached) && !end_reached) {
    char c;
    if (!buffer->Decode(&c)) {
      return false;
    }
    *out_string += c;
  }
  return true;
}